

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

char_t __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::get(input_stream_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
  *in_RDI;
  char_t ch;
  pos_t in_stack_00000030;
  pos_t *in_stack_00000038;
  pos_t in_stack_00000040;
  buf_t *in_stack_00000048;
  istream_t *in_stack_00000050;
  value_type *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char_t local_1;
  
  bVar1 = at_end((input_stream_t<cfgfile::string_trait_t> *)
                 CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (bVar1) {
    local_1 = '\0';
  }
  else {
    std::
    stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
    ::push(in_RDI,in_stack_ffffffffffffffc8);
    (in_RDI->c).
    super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur =
         (_Elt_pointer)
         ((long)&((in_RDI->c).
                  super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->m_column_number + 1);
    bVar1 = std::stack<char,_std::deque<char,_std::allocator<char>_>_>::empty
                      ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x12de6a);
    if (bVar1) {
      if (in_RDI[3].c.
          super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
          ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x200) {
        string_trait_t::fill_buf
                  (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                   in_stack_00000030);
        in_RDI[3].c.
        super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      }
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[2].c.
                           super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first,
                          (size_type)
                          in_RDI[3].c.
                          super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                          ._M_impl.super__Deque_impl_data._M_map);
      local_1 = *pvVar3;
      in_RDI[3].c.
      super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((long)in_RDI[3].c.
                  super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                  ._M_impl.super__Deque_impl_data._M_map + 1);
      bVar1 = is_new_line((input_stream_t<cfgfile::string_trait_t> *)
                          CONCAT17(local_1,in_stack_ffffffffffffffd8),(char_t *)in_RDI);
      if (bVar1) {
        (in_RDI->c).
        super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
        ._M_impl.super__Deque_impl_data._M_map_size =
             (in_RDI->c).
             super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
             ._M_impl.super__Deque_impl_data._M_map_size + 1;
        (in_RDI->c).
        super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x1;
      }
    }
    else {
      pvVar2 = std::stack<char,_std::deque<char,_std::allocator<char>_>_>::top
                         ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x12de7f);
      local_1 = *pvVar2;
      std::stack<char,_std::deque<char,_std::allocator<char>_>_>::pop
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x12de96);
      bVar1 = is_new_line((input_stream_t<cfgfile::string_trait_t> *)
                          CONCAT17(local_1,in_stack_ffffffffffffffd8),(char_t *)in_RDI);
      if (bVar1) {
        (in_RDI->c).
        super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
        ._M_impl.super__Deque_impl_data._M_map_size =
             (in_RDI->c).
             super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
             ._M_impl.super__Deque_impl_data._M_map_size + 1;
        (in_RDI->c).
        super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x1;
      }
    }
  }
  return local_1;
}

Assistant:

typename Trait::char_t get()
	{
		if( !at_end() )
		{
			m_prev_positions.push( { m_column_number, m_line_number } );

			m_column_number += 1;

			typename Trait::char_t ch( 0x00 );

			if( !m_returned_char.empty() )
			{
				ch = m_returned_char.top();

				m_returned_char.pop();

				if( is_new_line( ch ) )
				{
					m_line_number += 1;
					m_column_number = 1;
				}

				return ch;
			}

			if( m_buf_pos == c_buff_size )
			{
				Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
				m_buf_pos = 0;
			}

			ch = m_buf[ m_buf_pos ];

			++m_buf_pos;

			if( is_new_line( ch ) )
			{
				m_line_number += 1;
				m_column_number = 1;
			}

			return ch;
		}
		else
			return typename Trait::char_t( 0x00 );
	}